

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.cc
# Opt level: O0

void __thiscall
xLearn::Predictor::sigmoid
          (Predictor *this,vector<float,_std::allocator<float>_> *in,
          vector<float,_std::allocator<float>_> *out)

{
  size_type sVar1;
  size_type sVar2;
  ostream *poVar3;
  ostream *poVar4;
  reference pvVar5;
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  double dVar6;
  size_t i;
  allocator *function;
  int line;
  string *in_stack_ffffffffffffff78;
  ulong uVar7;
  ulong __n;
  LogSeverity in_stack_ffffffffffffff84;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  Logger local_1c;
  vector<float,_std::allocator<float>_> *local_18;
  vector<float,_std::allocator<float>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(local_18);
  if (sVar1 != sVar2) {
    Logger::Logger(&local_1c,ERR);
    line = (int)(sVar1 >> 0x20);
    function = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/inference.cc"
               ,function);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"sigmoid",(allocator *)&stack0xffffffffffffff87);
    poVar3 = Logger::Start(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,line,
                           (string *)function);
    poVar3 = std::operator<<(poVar3,"CHECK_EQ failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/inference.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x47);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"in.size()");
    poVar3 = std::operator<<(poVar3," = ");
    sVar1 = std::vector<float,_std::allocator<float>_>::size(local_10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar1);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"out.size()");
    poVar3 = std::operator<<(poVar3," = ");
    sVar1 = std::vector<float,_std::allocator<float>_>::size(local_18);
    poVar4 = (ostream *)std::ostream::operator<<(poVar3,sVar1);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Logger::~Logger((Logger *)poVar3);
    abort();
  }
  uVar7 = 0;
  while( true ) {
    __n = uVar7;
    sVar1 = std::vector<float,_std::allocator<float>_>::size(local_10);
    if (sVar1 <= uVar7) break;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](local_10,__n);
    dVar6 = std::exp((double)(ulong)(uint)-*pvVar5);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](local_18,__n);
    *pvVar5 = 1.0 / (SUB84(dVar6,0) + 1.0);
    uVar7 = __n + 1;
  }
  return;
}

Assistant:

void Predictor::sigmoid(std::vector<real_t>& in, 
                        std::vector<real_t>& out) {
  CHECK_EQ(in.size(), out.size());
  for (size_t i = 0; i < in.size(); ++i) {
    out[i] = 1.0 / (1.0 + exp(-in[i]));
  }
}